

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvsFoodWeb_ASAp_kry.c
# Opt level: O2

int fB(sunrealtype t,N_Vector c,N_Vector cB,N_Vector cBdot,void *user_data)

{
  long lVar1;
  long lVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  uint uVar6;
  uint uVar7;
  int iVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  ulong uVar12;
  double *pdVar13;
  long lVar14;
  long lVar15;
  uint uVar16;
  long lVar17;
  double *pdVar18;
  long lVar19;
  long lVar20;
  uint uVar21;
  long lVar22;
  long lVar23;
  ulong uVar24;
  int iVar25;
  long lVar26;
  long lVar27;
  ulong uVar28;
  long lVar29;
  long lVar30;
  ulong uVar31;
  long lVar32;
  long lVar33;
  long local_c0;
  ulong local_a0;
  ulong local_98;
  
  lVar9 = N_VGetArrayPointer();
  lVar10 = N_VGetArrayPointer(cB);
  lVar11 = N_VGetArrayPointer(cBdot);
  uVar6 = *(uint *)((long)user_data + 0x40);
  lVar15 = (long)user_data + 0x328;
  lVar30 = (long)user_data + 0x4e28;
  uVar7 = *(uint *)((long)user_data + 0x44);
  dVar3 = *(double *)((long)user_data + 0x310);
  dVar4 = *(double *)((long)user_data + 0x318);
  lVar27 = 0;
  uVar28 = 0;
  if (0 < (int)uVar6) {
    uVar28 = (ulong)uVar6;
  }
  uVar31 = (ulong)uVar6;
  lVar1 = (long)(int)uVar7 * 8;
  lVar2 = (long)(int)uVar6 * 8;
  lVar33 = lVar10;
  local_c0 = lVar9;
  for (lVar23 = 0; lVar23 != 0x14; lVar23 = lVar23 + 1) {
    uVar16 = uVar7;
    if (lVar23 == 0x13) {
      uVar16 = -uVar7;
    }
    uVar21 = uVar7;
    if (lVar23 != 0) {
      uVar21 = -uVar7;
    }
    local_a0 = (ulong)(uVar21 + (int)lVar27);
    local_98 = (ulong)(uVar16 + (int)lVar27);
    lVar14 = lVar15;
    lVar22 = local_c0;
    lVar26 = lVar27;
    lVar29 = lVar30;
    lVar32 = lVar33;
    for (lVar20 = 0; lVar20 != 0x14; lVar20 = lVar20 + 1) {
      lVar17 = lVar20 * (int)uVar6 + lVar23 * (int)uVar7;
      lVar19 = lVar9 + lVar17 * 8;
      for (uVar12 = 0; uVar28 != uVar12; uVar12 = uVar12 + 1) {
        *(double *)(lVar14 + uVar12 * 8) =
             *(double *)((long)user_data + uVar12 * 8 + 0x250) *
             ((double)(int)lVar20 * dVar3 * (double)(int)lVar23 * dVar4 + 1.0);
      }
      pdVar13 = (double *)((long)user_data + 0x130);
      for (uVar12 = 0; uVar12 != uVar28; uVar12 = uVar12 + 1) {
        pdVar18 = pdVar13;
        for (uVar24 = 0; uVar31 != uVar24; uVar24 = uVar24 + 1) {
          *(double *)(lVar14 + uVar24 * 8) =
               *pdVar18 * *(double *)(lVar19 + uVar12 * 8) + *(double *)(lVar14 + uVar24 * 8);
          pdVar18 = pdVar18 + 6;
        }
        pdVar13 = pdVar13 + 1;
      }
      for (uVar12 = 0; uVar28 != uVar12; uVar12 = uVar12 + 1) {
        dVar5 = *(double *)(lVar14 + uVar12 * 8);
        *(double *)(lVar14 + 0x4b00 + uVar12 * 8) = *(double *)(lVar32 + uVar12 * 8) * dVar5;
        *(double *)(lVar14 + uVar12 * 8) = dVar5 * *(double *)(lVar22 + uVar12 * 8);
      }
      pdVar13 = (double *)((long)user_data + 0x130);
      for (uVar12 = 0; uVar12 != uVar28; uVar12 = uVar12 + 1) {
        for (uVar24 = 0; uVar31 != uVar24; uVar24 = uVar24 + 1) {
          *(double *)(lVar29 + uVar24 * 8) =
               pdVar13[uVar24] * *(double *)(lVar19 + uVar12 * 8) *
               *(double *)(lVar10 + lVar17 * 8 + uVar12 * 8) + *(double *)(lVar29 + uVar24 * 8);
        }
        pdVar13 = pdVar13 + 6;
      }
      uVar16 = uVar6;
      if (lVar20 == 0x13) {
        uVar16 = -uVar6;
      }
      uVar21 = uVar6;
      if (lVar20 != 0) {
        uVar21 = -uVar6;
      }
      iVar25 = (int)lVar26;
      for (uVar12 = 0; uVar28 != uVar12; uVar12 = uVar12 + 1) {
        iVar8 = (int)uVar12;
        lVar19 = (long)(iVar25 + iVar8);
        dVar5 = *(double *)(lVar10 + lVar19 * 8);
        *(double *)(lVar11 + lVar19 * 8) =
             (-*(double *)((long)user_data + uVar12 * 8 + 0x2e0) *
              ((*(double *)(lVar10 + (long)((int)local_98 + iVar8) * 8) - dVar5) -
              (dVar5 - *(double *)(lVar10 + (long)((int)local_a0 + iVar8) * 8))) -
             ((*(double *)(lVar10 + (long)(int)(uVar16 + iVar25 + iVar8) * 8) - dVar5) -
             (dVar5 - *(double *)(lVar10 + (long)(int)(uVar21 + iVar25 + iVar8) * 8))) *
             *(double *)((long)user_data + uVar12 * 8 + 0x2b0)) -
             *(double *)((long)user_data + lVar19 * 8 + 0x4e28);
      }
      lVar14 = lVar14 + lVar2;
      lVar22 = lVar22 + lVar2;
      lVar32 = lVar32 + lVar2;
      lVar29 = lVar29 + lVar2;
      lVar26 = lVar26 + uVar31;
      local_a0 = local_a0 + uVar31;
      local_98 = local_98 + uVar31;
    }
    lVar15 = lVar15 + lVar1;
    local_c0 = local_c0 + lVar1;
    lVar33 = lVar33 + lVar1;
    lVar30 = lVar30 + lVar1;
    lVar27 = lVar27 + (ulong)uVar7;
  }
  return 0;
}

Assistant:

static int fB(sunrealtype t, N_Vector c, N_Vector cB, N_Vector cBdot,
              void* user_data)
{
  int i, ic, ici, idxl, idxu, idyl, idyu, iyoff, jx, jy, ns, mxns;
  sunrealtype dcxli, dcxui, dcyli, dcyui, x, y, *cox, *coy, *fsave, *fBsave, dx,
    dy;
  sunrealtype *cdata, *cBdata, *cBdotdata;
  WebData wdata;

  wdata     = (WebData)user_data;
  cdata     = N_VGetArrayPointer(c);
  cBdata    = N_VGetArrayPointer(cB);
  cBdotdata = N_VGetArrayPointer(cBdot);

  mxns   = wdata->mxns;
  ns     = wdata->ns;
  fsave  = wdata->fsave;
  fBsave = wdata->fBsave;
  cox    = wdata->cox;
  coy    = wdata->coy;
  mxns   = wdata->mxns;
  dx     = wdata->dx;
  dy     = wdata->dy;

  for (jy = 0; jy < MY; jy++)
  {
    y     = jy * dy;
    iyoff = mxns * jy;
    idyu  = (jy == MY - 1) ? -mxns : mxns;
    idyl  = (jy == 0) ? -mxns : mxns;
    for (jx = 0; jx < MX; jx++)
    {
      x  = jx * dx;
      ic = iyoff + ns * jx;
      /* Get interaction rates at one point (x,y). */
      WebRatesB(x, y, t, cdata + ic, cBdata + ic, fsave + ic, fBsave + ic, wdata);
      idxu = (jx == MX - 1) ? -ns : ns;
      idxl = (jx == 0) ? -ns : ns;
      for (i = 1; i <= ns; i++)
      {
        ici = ic + i - 1;
        /* Do differencing in y. */
        dcyli = cBdata[ici] - cBdata[ici - idyl];
        dcyui = cBdata[ici + idyu] - cBdata[ici];
        /* Do differencing in x. */
        dcxli = cBdata[ici] - cBdata[ici - idxl];
        dcxui = cBdata[ici + idxu] - cBdata[ici];
        /* Collect terms and load cdot elements. */
        cBdotdata[ici] = -coy[i - 1] * (dcyui - dcyli) -
                         cox[i - 1] * (dcxui - dcxli) - fBsave[ici];
      }
    }
  }

  return (0);
}